

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O1

UBool icu_63::TimeZone::parseCustomID
                (UnicodeString *id,int32_t *sign,int32_t *hour,int32_t *min,int32_t *sec)

{
  short sVar1;
  ushort uVar2;
  int32_t iVar3;
  int8_t iVar4;
  int iVar5;
  NumberFormat *pNVar6;
  char16_t *pcVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  ParsePosition pos;
  UErrorCode success;
  UnicodeString idUppercase;
  Formattable n;
  ParsePosition local_180;
  int *local_170;
  UErrorCode local_164;
  UChar *local_160;
  UnicodeString local_150;
  undefined1 local_110 [224];
  
  local_170 = sec;
  UnicodeString::UnicodeString(&local_150,id);
  Locale::Locale((Locale *)local_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
  UnicodeString::toUpper(&local_150,(Locale *)local_110);
  Locale::~Locale((Locale *)local_110);
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar10 = (id->fUnion).fFields.fLength;
  }
  else {
    iVar10 = (int)sVar1 >> 5;
  }
  if (iVar10 < 4) {
    bVar12 = false;
  }
  else {
    iVar4 = UnicodeString::doCompare(&local_150,0,3,L"GMT",0,3);
    bVar12 = iVar4 == '\0';
    local_160 = L"GMT";
  }
  bVar11 = false;
  if (!bVar12) goto LAB_001f1e18;
  local_180.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003ae398;
  local_180.index = 3;
  local_180.errorIndex = -1;
  *sign = 1;
  *hour = 0;
  *min = 0;
  *local_170 = 0;
  uVar2 = (id->fUnion).fStackFields.fLengthAndFlags;
  if ((short)uVar2 < 0) {
    uVar8 = *(uint *)((long)&id->fUnion + 4);
  }
  else {
    uVar8 = (int)(short)uVar2 >> 5;
  }
  if (3 < uVar8) {
    if (((int)(short)uVar2 & 2U) == 0) {
      pcVar7 = (id->fUnion).fFields.fArray;
    }
    else {
      pcVar7 = (char16_t *)((long)&id->fUnion + 2);
    }
    if (pcVar7[3] == L'-') {
      *sign = -1;
LAB_001f1b8d:
      local_180.index = 4;
      local_180.errorIndex = -1;
      local_164 = U_ZERO_ERROR;
      pNVar6 = NumberFormat::createInstance(&local_164);
      if (local_164 < U_ILLEGAL_ARGUMENT_ERROR) {
        (*(pNVar6->super_Format).super_UObject._vptr_UObject[0x17])(pNVar6,1);
        iVar3 = local_180.index;
        Formattable::Formattable((Formattable *)local_110,-99999);
        (*(pNVar6->super_Format).super_UObject._vptr_UObject[0x14])(pNVar6,id,local_110,&local_180);
        if (local_180.index == iVar3) goto LAB_001f1bfb;
        *hour = local_110._8_4_;
        sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar8 = (id->fUnion).fFields.fLength;
        }
        else {
          uVar8 = (int)sVar1 >> 5;
        }
        iVar10 = local_180.index - iVar3;
        if (local_180.index < (int)uVar8) {
          if ((iVar10 < 3) && ((uint)local_180.index < uVar8)) {
            if (((int)sVar1 & 2U) == 0) {
              pcVar7 = (id->fUnion).fFields.fArray;
            }
            else {
              pcVar7 = (char16_t *)((long)&id->fUnion + 2);
            }
            if (pcVar7[local_180.index] != L':') goto LAB_001f1bfb;
            iVar10 = local_180.index + 1;
            local_180.index = iVar10;
            Formattable::setLong((Formattable *)local_110,-99999);
            (*(pNVar6->super_Format).super_UObject._vptr_UObject[0x14])
                      (pNVar6,id,local_110,&local_180);
            if (local_180.index - iVar10 == 2) {
              *min = local_110._8_4_;
              sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                uVar8 = (id->fUnion).fFields.fLength;
              }
              else {
                uVar8 = (int)sVar1 >> 5;
              }
              if ((int)uVar8 <= local_180.index) goto LAB_001f1dd3;
              if ((uint)local_180.index < uVar8) {
                if (((int)sVar1 & 2U) == 0) {
                  pcVar7 = (id->fUnion).fFields.fArray;
                }
                else {
                  pcVar7 = (char16_t *)((long)&id->fUnion + 2);
                }
                if (pcVar7[local_180.index] == L':') {
                  iVar10 = local_180.index + 1;
                  local_180.index = iVar10;
                  Formattable::setLong((Formattable *)local_110,-99999);
                  (*(pNVar6->super_Format).super_UObject._vptr_UObject[0x14])
                            (pNVar6,id,local_110,&local_180);
                  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
                  if (sVar1 < 0) {
                    iVar9 = (id->fUnion).fFields.fLength;
                  }
                  else {
                    iVar9 = (int)sVar1 >> 5;
                  }
                  if ((local_180.index == iVar9) && (local_180.index - iVar10 == 2)) {
                    *local_170 = local_110._8_4_;
                    goto LAB_001f1dd3;
                  }
                }
              }
            }
          }
          else {
LAB_001f1bfb:
            if (pNVar6 == (NumberFormat *)0x0) goto LAB_001f1e02;
          }
          (*(pNVar6->super_Format).super_UObject._vptr_UObject[1])(pNVar6);
LAB_001f1e02:
          bVar11 = false;
        }
        else {
          if (iVar10 - 1U < 6) {
            if (iVar10 - 5U < 2) {
              *local_170 = (int)local_110._8_4_ % 100;
              *min = (*hour / 100) % 100;
              iVar9 = *hour;
              iVar5 = iVar9 / 10000 + (iVar9 >> 0x1f);
            }
            else {
              if (1 < iVar10 - 3U) goto LAB_001f1dce;
              *min = (int)local_110._8_4_ % 100;
              iVar9 = *hour;
              iVar5 = iVar9 / 100 + (iVar9 >> 0x1f);
            }
            *hour = iVar5 - (iVar9 >> 0x1f);
          }
          else if (pNVar6 != (NumberFormat *)0x0) {
            (*(pNVar6->super_Format).super_UObject._vptr_UObject[1])(pNVar6);
          }
LAB_001f1dce:
          if (5 < iVar10 - 1U) goto LAB_001f1e02;
LAB_001f1dd3:
          if (pNVar6 != (NumberFormat *)0x0) {
            (*(pNVar6->super_Format).super_UObject._vptr_UObject[1])(pNVar6);
          }
          bVar11 = *local_170 < 0x3c && (*min < 0x3c && *hour < 0x18);
        }
        Formattable::~Formattable((Formattable *)local_110);
        goto LAB_001f1e0e;
      }
    }
    else if (3 < uVar8) {
      if ((uVar2 & 2) == 0) {
        pcVar7 = (id->fUnion).fFields.fArray;
      }
      else {
        pcVar7 = (char16_t *)((long)&id->fUnion + 2);
      }
      if (pcVar7[3] == L'+') goto LAB_001f1b8d;
    }
    bVar11 = false;
  }
LAB_001f1e0e:
  ParsePosition::~ParsePosition(&local_180);
LAB_001f1e18:
  UnicodeString::~UnicodeString(&local_150);
  return bVar11;
}

Assistant:

UBool
TimeZone::parseCustomID(const UnicodeString& id, int32_t& sign,
                        int32_t& hour, int32_t& min, int32_t& sec) {
    static const int32_t         kParseFailed = -99999;

    NumberFormat* numberFormat = 0;
    UnicodeString idUppercase = id;
    idUppercase.toUpper("");

    if (id.length() > GMT_ID_LENGTH &&
        idUppercase.startsWith(GMT_ID, GMT_ID_LENGTH))
    {
        ParsePosition pos(GMT_ID_LENGTH);
        sign = 1;
        hour = 0;
        min = 0;
        sec = 0;

        if (id[pos.getIndex()] == MINUS /*'-'*/) {
            sign = -1;
        } else if (id[pos.getIndex()] != PLUS /*'+'*/) {
            return FALSE;
        }
        pos.setIndex(pos.getIndex() + 1);

        UErrorCode success = U_ZERO_ERROR;
        numberFormat = NumberFormat::createInstance(success);
        if(U_FAILURE(success)){
            return FALSE;
        }
        numberFormat->setParseIntegerOnly(TRUE);
        //numberFormat->setLenient(TRUE); // TODO: May need to set this, depends on latest timezone parsing

        // Look for either hh:mm, hhmm, or hh
        int32_t start = pos.getIndex();
        Formattable n(kParseFailed);
        numberFormat->parse(id, n, pos);
        if (pos.getIndex() == start) {
            delete numberFormat;
            return FALSE;
        }
        hour = n.getLong();

        if (pos.getIndex() < id.length()) {
            if (pos.getIndex() - start > 2
                || id[pos.getIndex()] != COLON) {
                delete numberFormat;
                return FALSE;
            }
            // hh:mm
            pos.setIndex(pos.getIndex() + 1);
            int32_t oldPos = pos.getIndex();
            n.setLong(kParseFailed);
            numberFormat->parse(id, n, pos);
            if ((pos.getIndex() - oldPos) != 2) {
                // must be 2 digits
                delete numberFormat;
                return FALSE;
            }
            min = n.getLong();
            if (pos.getIndex() < id.length()) {
                if (id[pos.getIndex()] != COLON) {
                    delete numberFormat;
                    return FALSE;
                }
                // [:ss]
                pos.setIndex(pos.getIndex() + 1);
                oldPos = pos.getIndex();
                n.setLong(kParseFailed);
                numberFormat->parse(id, n, pos);
                if (pos.getIndex() != id.length()
                        || (pos.getIndex() - oldPos) != 2) {
                    delete numberFormat;
                    return FALSE;
                }
                sec = n.getLong();
            }
        } else {
            // Supported formats are below -
            //
            // HHmmss
            // Hmmss
            // HHmm
            // Hmm
            // HH
            // H

            int32_t length = pos.getIndex() - start;
            if (length <= 0 || 6 < length) {
                // invalid length
                delete numberFormat;
                return FALSE;
            }
            switch (length) {
                case 1:
                case 2:
                    // already set to hour
                    break;
                case 3:
                case 4:
                    min = hour % 100;
                    hour /= 100;
                    break;
                case 5:
                case 6:
                    sec = hour % 100;
                    min = (hour/100) % 100;
                    hour /= 10000;
                    break;
            }
        }

        delete numberFormat;

        if (hour > kMAX_CUSTOM_HOUR || min > kMAX_CUSTOM_MIN || sec > kMAX_CUSTOM_SEC) {
            return FALSE;
        }
        return TRUE;
    }
    return FALSE;
}